

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

ThreadCachePtr tcmalloc::ThreadCachePtr::GetReallySlow(void)

{
  bool bVar1;
  ThreadCache *pTVar2;
  Entry *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  ThreadCachePtr TVar4;
  Entry *allocated_registration;
  void *memory;
  ThreadCache *cache;
  Result tr;
  undefined1 local_10;
  
  ThreadCache::InitModule();
  SlowTLS::Lookup();
  bVar1 = SlowTLS::Result::Found((Result *)&cache);
  if (bVar1) {
    pTVar2 = SlowTLS::Result::GetCache((Result *)&cache);
    bVar1 = SlowTLS::Result::IsEmergencyMalloc((Result *)&cache);
    ThreadCachePtr((ThreadCachePtr *)&tr.entry_,pTVar2,bVar1);
    uVar3 = extraout_RDX;
  }
  else {
    pTVar2 = ThreadCache::NewHeap();
    this = (Entry *)MetaDataAlloc(0x28);
    SlowTLS::Entry::Entry(this,pTVar2);
    this->was_allocated = true;
    SlowTLS::RegisterEntry((Result *)&cache,this);
    ThreadCachePtr((ThreadCachePtr *)&tr.entry_,pTVar2,false);
    uVar3 = extraout_RDX_00;
  }
  TVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  TVar4.is_emergency_malloc_ = (bool)local_10;
  TVar4.ptr_ = (ThreadCache *)tr.entry_;
  return TVar4;
}

Assistant:

ATTRIBUTE_NOINLINE
ThreadCachePtr ThreadCachePtr::GetReallySlow() {
  // This is called after we found no cache in regular TLS storage and
  // that TLS storage key isn't set up yet. I.e. process is running,
  // but not all C++ initializers (in this specific case,
  // InitThreadCachePtrLate) ran yet.
  //
  // Not just only that, but we might be dealing with entirely
  // uninitialized malloc. So we handle that first.
  ThreadCache::InitModule();

  // InitModule does some locking (and super-unlikely, but not
  // impossibly, some sleeping). Also it runs some malloc as well
  // (e.g. for pthread_atfork). So here we might actually find
  // thread's cache to be present.

  SlowTLS::Result tr = SlowTLS::Lookup();

  if (tr.Found()) {
    return {tr.GetCache(), tr.IsEmergencyMalloc()};
  }

  ThreadCache* cache = ThreadCache::NewHeap();

  // Note, we allocate slow tls registration and "leak" it. We expect
  // just single thread (initial thread) in most common cases. And
  // maybe, very rarely several. So leaking a little memory is totally
  // harmless. After all, it is our general approach to never free
  // metadata allocations. Plus, those threads that are either initial
  // thread or are allocated before program's main() tend to live
  // forever anyways.
  void* memory = MetaDataAlloc(sizeof(SlowTLS::Entry));
  SlowTLS::Entry* allocated_registration = new (memory) SlowTLS::Entry{cache};
  allocated_registration->was_allocated = true;

  SlowTLS::RegisterEntry(&tr, allocated_registration);

  return {cache, false};
}